

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O3

void erase_suite::erase_ending(void)

{
  pair<int,_int> *ppVar1;
  pair<int,_int> pVar2;
  pair<int,_int> pVar3;
  pair<int,_int> pVar4;
  bool bVar5;
  initializer_list<vista::pair<int,_int>_> __l;
  initializer_list<vista::pair<int,_int>_> __l_00;
  initializer_list<vista::pair<int,_int>_> __l_01;
  initializer_list<vista::pair<int,_int>_> __l_02;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> expect_1;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> expect;
  allocator_type local_89;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> local_88;
  undefined8 uStack_70;
  pair<int,_int> local_60 [2];
  undefined8 local_50;
  undefined8 uStack_48;
  pair<int,_int> local_40;
  pair<int,_int> local_38;
  pair<int,_int> local_30;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> local_28;
  
  uStack_48 = 0;
  local_38 = (pair<int,_int>)&local_40;
  local_40 = (pair<int,_int>)local_60;
  local_60[0].first = 0xb;
  local_60[0].second = 1;
  local_60[1].first = 0x16;
  local_60[1].second = 2;
  local_30 = (pair<int,_int>)&uStack_48;
  local_50 = 0x300000021;
  if ((local_40 != local_30) && (pVar3 = (pair<int,_int>)&local_50, pVar3 != local_40)) {
    pVar2.first = 0x21;
    pVar2.second = 0;
    do {
      if (((pair<int,_int> *)((long)pVar3 + -8))->first <= pVar2.first) break;
      pVar2 = *(pair<int,_int> *)pVar3;
      *(pair<int,_int> *)pVar3 = *(pair<int,_int> *)((long)pVar3 + -8);
      *(pair<int,_int> *)((long)pVar3 + -8) = pVar2;
      pVar3 = (pair<int,_int>)((long)pVar3 + -8);
    } while (pVar3 != local_40);
  }
  if (((local_30 != local_38) && (local_30 = (pair<int,_int>)&local_40, local_40 != local_30)) &&
     (pVar3 = (pair<int,_int>)&uStack_48, pVar3 != local_40)) {
    pVar4.first = 0x2c;
    pVar4.second = 0;
    do {
      if (((pair<int,_int> *)((long)pVar3 + -8))->first <= pVar4.first) break;
      pVar4 = *(pair<int,_int> *)pVar3;
      *(pair<int,_int> *)pVar3 = *(pair<int,_int> *)((long)pVar3 + -8);
      *(pair<int,_int> *)((long)pVar3 + -8) = pVar4;
      pVar3 = (pair<int,_int>)((long)pVar3 + -8);
    } while (pVar3 != local_40);
  }
  local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000021;
  uStack_70 = 0x40000002c;
  local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000b;
  local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x200000016;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_88;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_28,__l,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x192,"void erase_suite::erase_ending()",(pair<int,_int> *)local_40,
             (pair<int,_int> *)local_30,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_28.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_28.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_28.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar2 = local_30;
  pVar3 = (pair<int,_int>)((long)local_30 + -8);
  ppVar1 = (pair<int,_int> *)((long)local_30 + -8);
  ppVar1->first = 0;
  ppVar1->second = 0;
  if ((local_30 != pVar3) &&
     (pVar4 = (pair<int,_int>)((long)local_30 + -8), bVar5 = local_30 != pVar2, local_30 = pVar4,
     bVar5)) {
    do {
      *(pair<int,_int> *)pVar3 = *(pair<int,_int> *)((long)pVar3 + 8);
      ((pair<int,_int> *)((long)pVar3 + 8))->first = 0;
      ((pair<int,_int> *)((long)pVar3 + 8))->second = 0;
      pVar3 = (pair<int,_int>)((long)pVar3 + 8);
    } while (pVar3 != pVar4);
  }
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000b;
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000016;
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000021;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_28;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_88,__l_00,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x199,"void erase_suite::erase_ending()",(pair<int,_int> *)local_40,
             (pair<int,_int> *)local_30,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar2 = local_30;
  pVar3 = (pair<int,_int>)((long)local_30 + -8);
  ppVar1 = (pair<int,_int> *)((long)local_30 + -8);
  ppVar1->first = 0;
  ppVar1->second = 0;
  if ((local_30 != pVar3) &&
     (pVar4 = (pair<int,_int>)((long)local_30 + -8), bVar5 = local_30 != pVar2, local_30 = pVar4,
     bVar5)) {
    do {
      *(pair<int,_int> *)pVar3 = *(pair<int,_int> *)((long)pVar3 + 8);
      ((pair<int,_int> *)((long)pVar3 + 8))->first = 0;
      ((pair<int,_int> *)((long)pVar3 + 8))->second = 0;
      pVar3 = (pair<int,_int>)((long)pVar3 + 8);
    } while (pVar3 != pVar4);
  }
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000b;
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000016;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_28;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_88,__l_01,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x19f,"void erase_suite::erase_ending()",(pair<int,_int> *)local_40,
             (pair<int,_int> *)local_30,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar2 = local_30;
  pVar3 = (pair<int,_int>)((long)local_30 + -8);
  ppVar1 = (pair<int,_int> *)((long)local_30 + -8);
  ppVar1->first = 0;
  ppVar1->second = 0;
  if ((local_30 != pVar3) &&
     (pVar4 = (pair<int,_int>)((long)local_30 + -8), bVar5 = local_30 != pVar2, local_30 = pVar4,
     bVar5)) {
    do {
      *(pair<int,_int> *)pVar3 = *(pair<int,_int> *)((long)pVar3 + 8);
      ((pair<int,_int> *)((long)pVar3 + 8))->first = 0;
      ((pair<int,_int> *)((long)pVar3 + 8))->second = 0;
      pVar3 = (pair<int,_int>)((long)pVar3 + 8);
    } while (pVar3 != pVar4);
  }
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000b;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_28;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_88,__l_02,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x1a5,"void erase_suite::erase_ending()",(pair<int,_int> *)local_40,
             (pair<int,_int> *)local_30,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar2 = local_30;
  pVar3 = (pair<int,_int>)((long)local_30 + -8);
  ppVar1 = (pair<int,_int> *)((long)local_30 + -8);
  ppVar1->first = 0;
  ppVar1->second = 0;
  if ((local_30 != pVar3) &&
     (pVar4 = (pair<int,_int>)((long)local_30 + -8), bVar5 = local_30 != pVar2, local_30 = pVar4,
     bVar5)) {
    do {
      *(pair<int,_int> *)pVar3 = *(pair<int,_int> *)((long)pVar3 + 8);
      ((pair<int,_int> *)((long)pVar3 + 8))->first = 0;
      ((pair<int,_int> *)((long)pVar3 + 8))->second = 0;
      pVar3 = (pair<int,_int>)((long)pVar3 + 8);
    } while (pVar3 != pVar4);
  }
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x1ab,"void erase_suite::erase_ending()",(pair<int,_int> *)local_40,
             (pair<int,_int> *)local_30,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )0x0,(__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
                    )0x0);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}